

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O2

_Bool Hacl_RSAPSS_rsapss_skey_sign
                (Spec_Hash_Definitions_hash_alg a,uint32_t modBits,uint32_t eBits,uint32_t dBits,
                uint8_t *nb,uint8_t *eb,uint8_t *db,uint32_t saltLen,uint8_t *salt,uint32_t msgLen,
                uint8_t *msg,uint8_t *sgnt)

{
  uint uVar1;
  long lVar2;
  uint8_t *eb_00;
  uint8_t *nb_00;
  undefined8 uVar3;
  ulong uVar4;
  Spec_Hash_Definitions_hash_alg a_00;
  _Bool _Var5;
  uint64_t uVar6;
  undefined4 in_register_0000000c;
  ulong uVar7;
  undefined7 in_register_00000039;
  uint64_t *pkey;
  uint64_t *pkey_00;
  undefined8 auStack_90 [2];
  ulong auStack_80 [3];
  uint64_t uStack_68;
  uint8_t *local_60;
  uint8_t *local_58;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  undefined4 local_34;
  
  local_50 = CONCAT44(in_register_0000000c,dBits);
  local_34 = (undefined4)CONCAT71(in_register_00000039,a);
  uVar1 = (eBits - 1 >> 6) + (modBits - 1 >> 6) * 2;
  uVar7 = (ulong)(((dBits - 1 >> 6) + uVar1) * 8);
  lVar2 = -(uVar7 + 0x2f & 0xfffffffffffffff0);
  pkey_00 = (uint64_t *)((long)&uStack_68 + lVar2);
  local_60 = eb;
  local_58 = nb;
  *(undefined8 *)((long)auStack_80 + lVar2 + 0x10) = 0x15217d;
  memset(pkey_00,0,uVar7 + 0x20);
  nb_00 = local_58;
  eb_00 = local_60;
  local_48 = (ulong)eBits;
  local_40 = (ulong)modBits;
  *(undefined8 *)((long)auStack_80 + lVar2 + 0x10) = 0x1521ab;
  _Var5 = load_pkey(modBits,eBits,nb_00,eb_00,pkey_00);
  uVar3 = local_50;
  *(undefined8 *)((long)auStack_80 + lVar2 + 0x10) = 0x1521c0;
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64((dBits - 1 >> 3) + 1,db,pkey_00 + (ulong)uVar1 + 3);
  *(undefined8 *)((long)auStack_80 + lVar2 + 0x10) = 0x1521cb;
  uVar6 = check_exponent_u64((uint32_t)uVar3,pkey_00 + (ulong)uVar1 + 3);
  uVar4 = local_40;
  uVar7 = local_48;
  if (_Var5) {
    _Var5 = false;
    if (uVar6 == 0xffffffffffffffff) {
      a_00 = (Spec_Hash_Definitions_hash_alg)local_34;
      *(uint8_t **)((long)auStack_80 + lVar2 + 0x10) = sgnt;
      *(uint8_t **)((long)auStack_80 + lVar2 + 8) = msg;
      *(ulong *)((long)auStack_80 + lVar2) = (ulong)msgLen;
      *(uint8_t **)((long)auStack_90 + lVar2 + 8) = salt;
      *(undefined8 *)((long)auStack_90 + lVar2) = 0x152203;
      _Var5 = Hacl_RSAPSS_rsapss_sign
                        (a_00,(uint32_t)uVar4,(uint32_t)uVar7,(uint32_t)uVar3,pkey_00,saltLen,
                         *(uint8_t **)((long)auStack_90 + lVar2 + 8),
                         *(uint32_t *)((long)auStack_80 + lVar2),
                         *(uint8_t **)((long)auStack_80 + lVar2 + 8),
                         *(uint8_t **)((long)auStack_80 + lVar2 + 0x10));
    }
  }
  else {
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

bool
Hacl_RSAPSS_rsapss_skey_sign(
  Spec_Hash_Definitions_hash_alg a,
  uint32_t modBits,
  uint32_t eBits,
  uint32_t dBits,
  uint8_t *nb,
  uint8_t *eb,
  uint8_t *db,
  uint32_t saltLen,
  uint8_t *salt,
  uint32_t msgLen,
  uint8_t *msg,
  uint8_t *sgnt
)
{
  KRML_CHECK_SIZE(sizeof (uint64_t),
    2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U + (dBits - 1U) / 64U + 1U);
  uint64_t
  skey[2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U + (dBits - 1U) / 64U + 1U];
  memset(skey,
    0U,
    (2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U + (dBits - 1U) / 64U + 1U)
    * sizeof (uint64_t));
  bool b = load_skey(modBits, eBits, dBits, nb, eb, db, skey);
  if (b)
  {
    return
      Hacl_RSAPSS_rsapss_sign(a,
        modBits,
        eBits,
        dBits,
        skey,
        saltLen,
        salt,
        msgLen,
        msg,
        sgnt);
  }
  return false;
}